

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O2

void __thiscall chrono::ChLinkTSDA::Update(ChLinkTSDA *this,double time,bool update_assets)

{
  ChBodyFrame *pCVar1;
  ChStateDelta state_w;
  ChState state_x;
  Type local_48;
  
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime = time;
  ChState::ChState(&state_x,(long)this->m_nstates + 0xe,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&state_w,(long)this->m_nstates + 0xc,(ChIntegrable *)0x0);
  pCVar1 = (this->super_ChLink).Body1;
  (**(code **)((long)*(double *)
                      ((long)&pCVar1[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data + 0x40) + 0x210))
            ((double *)
             ((long)&pCVar1[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x40),0,&state_x);
  pCVar1 = (this->super_ChLink).Body2;
  (**(code **)((long)*(double *)
                      ((long)&pCVar1[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data + 0x40) + 0x210))
            ((double *)
             ((long)&pCVar1[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x40),7,&state_x);
  pCVar1 = (this->super_ChLink).Body1;
  (**(code **)((long)*(double *)
                      ((long)&pCVar1[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data + 0x40) + 0x218))
            ((double *)
             ((long)&pCVar1[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x40),0,&state_w);
  pCVar1 = (this->super_ChLink).Body2;
  (**(code **)((long)*(double *)
                      ((long)&pCVar1[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data + 0x40) + 0x218))
            ((double *)
             ((long)&pCVar1[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x40),6,&state_w);
  if (this->m_variables != (ChVariablesGenericDiagonalMass *)0x0) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_48,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&state_x,0xe,
               this->m_nstates);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::setZero
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_48);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_48,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&state_w,0xc,
               this->m_nstates);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&local_48.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
               &this->m_states);
  }
  ComputeQ(this,time,&state_x,&state_w,&this->m_Qforce);
  if (this->m_stiff == true) {
    if (this->m_jacobians == (SpringJacobians *)0x0) {
      CreateJacobianMatrices(this);
    }
    ComputeJacobians(this,time,&state_x,&state_w);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_48,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&state_w,0xc,
               this->m_nstates);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              (&this->m_states,
               &local_48.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
  }
  ChPhysicsItem::Update
            ((ChPhysicsItem *)this,
             (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime,
             update_assets);
  Eigen::internal::handmade_aligned_free
            (state_w.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (state_x.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void ChLinkTSDA::Update(double time, bool update_assets) {
    ChTime = time;

    // Pack states and state derivatives for the two connected bodies and ODE states (if present)
    ChState state_x(14 + m_nstates, nullptr);
    ChStateDelta state_w(12 + m_nstates, nullptr);

    static_cast<ChBody*>(Body1)->LoadableGetStateBlock_x(0, state_x);
    static_cast<ChBody*>(Body2)->LoadableGetStateBlock_x(7, state_x);

    static_cast<ChBody*>(Body1)->LoadableGetStateBlock_w(0, state_w);
    static_cast<ChBody*>(Body2)->LoadableGetStateBlock_w(6, state_w);

    if (m_variables) {
        state_x.segment(14, m_nstates).setZero();
        state_w.segment(12, m_nstates) = m_states;
    }

    // Compute forcing terms at current states (this also updates link kinematics)
    ComputeQ(time, state_x, state_w, m_Qforce);

    // Compute Jacobians (if needed)
    if (m_stiff) {
        if (!m_jacobians)
            CreateJacobianMatrices();
        // Compute Jacobian matrices
        ComputeJacobians(time, state_x, state_w);
        // Restore the states (may have been perturbed during Jacobian calculation)
        m_states = state_w.segment(12, m_nstates);
    }

    // Update assets
    ChPhysicsItem::Update(ChTime, update_assets);
}